

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void decrease_morale(tgestate_t *state,uint8_t delta)

{
  int iVar1;
  int iVar2;
  undefined3 in_register_00000031;
  
  iVar1 = (uint)state->morale - CONCAT31(in_register_00000031,delta);
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  state->morale = (uint8_t)iVar2;
  return;
}

Assistant:

void decrease_morale(tgestate_t *state, uint8_t delta)
{
  int decreased_morale;

  assert(state != NULL);
  assert(delta > 0);

  decreased_morale = state->morale - delta;
  if (decreased_morale < morale_MIN)
    decreased_morale = morale_MIN;

  assert(decreased_morale >= morale_MIN);
  assert(decreased_morale <= morale_MAX);

  /* Conv: This jumps into the tail end of increase_morale in the original
   * code. */
  state->morale = decreased_morale;
}